

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chachapoly.c
# Opt level: O1

int mbedtls_chachapoly_encrypt_and_tag
              (mbedtls_chachapoly_context *ctx,size_t length,uchar *nonce,uchar *aad,size_t aad_len,
              uchar *input,uchar *output,uchar *tag)

{
  int iVar1;
  
  iVar1 = chachapoly_crypt_and_tag
                    (ctx,MBEDTLS_CHACHAPOLY_ENCRYPT,length,nonce,aad,aad_len,input,output,tag);
  return iVar1;
}

Assistant:

int mbedtls_chachapoly_encrypt_and_tag( mbedtls_chachapoly_context *ctx,
                                        size_t length,
                                        const unsigned char nonce[12],
                                        const unsigned char *aad,
                                        size_t aad_len,
                                        const unsigned char *input,
                                        unsigned char *output,
                                        unsigned char tag[16] )
{
    CHACHAPOLY_VALIDATE_RET( ctx   != NULL );
    CHACHAPOLY_VALIDATE_RET( nonce != NULL );
    CHACHAPOLY_VALIDATE_RET( tag   != NULL );
    CHACHAPOLY_VALIDATE_RET( aad_len == 0 || aad    != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || input  != NULL );
    CHACHAPOLY_VALIDATE_RET( length  == 0 || output != NULL );

    return( chachapoly_crypt_and_tag( ctx, MBEDTLS_CHACHAPOLY_ENCRYPT,
                                      length, nonce, aad, aad_len,
                                      input, output, tag ) );
}